

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O0

bool __thiscall
GraphContigger::solve_tip(GraphContigger *this,TangleView *t,Strider *s,GraphEditor *ge)

{
  long lVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  sgNodeID_t sVar5;
  vector<NodeView,_std::allocator<NodeView>_> *in_RSI;
  sgNodeID_t in_stack_00000048;
  GraphEditor *in_stack_00000050;
  vector<long,_std::allocator<long>_> f1s;
  vector<long,_std::allocator<long>_> f0s;
  undefined1 in_stack_000004ed;
  undefined1 in_stack_000004ee;
  undefined1 in_stack_000004ef;
  sgNodeID_t in_stack_000004f0;
  Strider *in_stack_000004f8;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff00;
  vector<long,_std::allocator<long>_> local_78 [2];
  vector<long,_std::allocator<long>_> local_40;
  vector<NodeView,_std::allocator<NodeView>_> *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  pvVar2 = std::vector<NodeView,_std::allocator<NodeView>_>::operator[](in_RSI,0);
  NodeView::node_id(pvVar2);
  Strider::stride_out_in_order
            (in_stack_000004f8,in_stack_000004f0,(bool)in_stack_000004ef,(bool)in_stack_000004ee,
             (bool)in_stack_000004ed);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
            );
  SequenceDistanceGraphPath::~SequenceDistanceGraphPath((SequenceDistanceGraphPath *)0x4bf8d8);
  pvVar2 = std::vector<NodeView,_std::allocator<NodeView>_>::operator[](local_18,1);
  NodeView::node_id(pvVar2);
  Strider::stride_out_in_order
            (in_stack_000004f8,in_stack_000004f0,(bool)in_stack_000004ef,(bool)in_stack_000004ee,
             (bool)in_stack_000004ed);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
            );
  SequenceDistanceGraphPath::~SequenceDistanceGraphPath((SequenceDistanceGraphPath *)0x4bf950);
  sVar3 = std::vector<long,_std::allocator<long>_>::size(&local_40);
  if (1 < sVar3) {
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&local_40,1);
    lVar1 = *pvVar4;
    pvVar2 = std::vector<NodeView,_std::allocator<NodeView>_>::operator[](local_18,1);
    sVar5 = NodeView::node_id(pvVar2);
    if (lVar1 == sVar5) {
      sVar3 = std::vector<long,_std::allocator<long>_>::size(local_78);
      if (1 < sVar3) {
        pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](local_78,1);
        lVar1 = *pvVar4;
        pvVar2 = std::vector<NodeView,_std::allocator<NodeView>_>::operator[](local_18,0);
        sVar5 = NodeView::node_id(pvVar2);
        if (lVar1 == sVar5) {
          pvVar2 = std::vector<NodeView,_std::allocator<NodeView>_>::operator[](local_18 + 1,0);
          in_stack_ffffffffffffff00 =
               (vector<long,_std::allocator<long>_> *)NodeView::node_id(pvVar2);
          local_1 = GraphEditor::queue_node_deletion(in_stack_00000050,in_stack_00000048);
          goto LAB_004bfab8;
        }
      }
    }
  }
  local_1 = false;
LAB_004bfab8:
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_ffffffffffffff00);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_ffffffffffffff00);
  return (bool)(local_1 & 1);
}

Assistant:

bool GraphContigger::solve_tip(TangleView &t, Strider &s, GraphEditor &ge){
    //just check that each frontier connects to the other one through reads
    auto f0s = s.stride_out_in_order(-t.frontiers[0].node_id()).nodes;
    auto f1s = s.stride_out_in_order(-t.frontiers[1].node_id()).nodes;
    if (f0s.size()>1 and f0s[1]==t.frontiers[1].node_id() and f1s.size()>1 and f1s[1]==t.frontiers[0].node_id()){
        return ge.queue_node_deletion(t.internals[0].node_id());
    }
    return false;
}